

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

void __thiscall Rml::DataViewValue::DataViewValue(DataViewValue *this,Element *element)

{
  allocator<char> local_39;
  String local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"value",&local_39);
  DataViewAttribute::DataViewAttribute(&this->super_DataViewAttribute,element,&local_38,100);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_DataViewAttribute).super_DataViewCommon.super_DataView.super_Releasable.
  _vptr_Releasable = (_func_int **)&PTR__DataViewCommon_00396a18;
  return;
}

Assistant:

DataViewValue::DataViewValue(Element* element) : DataViewAttribute(element, "value", SortOffset_DataValue) {}